

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O2

void __thiscall cali::Caliper::end(Caliper *this,Attribute *attr)

{
  ThreadData *pTVar1;
  pointer pCVar2;
  uint prop;
  cali_id_t cVar3;
  uint uVar4;
  mutex *pmVar5;
  cali_id_t key;
  Channel *channel;
  pointer pCVar6;
  element_type *local_b8;
  Caliper *local_b0;
  BlackboardEntry local_a8;
  BlackboardEntry local_78;
  Node *local_48;
  anon_union_8_7_33918203_for_value aStack_40;
  
  if (this->sT->stack_error != false) {
    return;
  }
  prop = Attribute::properties(attr);
  uVar4 = prop & 0x3c;
  if (attr->m_node == (Node *)0x0) {
    cVar3 = 0xffffffffffffffff;
  }
  else {
    cVar3 = attr->m_node->m_id;
  }
  key = (ulong)((prop >> 10 & 1) != 0) + 1;
  if ((prop & 1) != 0) {
    key = cVar3;
  }
  pTVar1 = this->sT;
  (pTVar1->lock).m_lock = (pTVar1->lock).m_lock + 1;
  if (uVar4 == 0x14) {
    anon_unknown.dwarf_36ee15::load_current_entry(&local_a8,attr,key,&pTVar1->thread_blackboard);
    local_78.entry.m_value.m_v.type_and_size = local_a8.entry.m_value.m_v.type_and_size;
    local_78.entry.m_value.m_v.value = local_a8.entry.m_value.m_v.value;
    local_78.merged_entry.m_value.m_v.value = local_a8.merged_entry.m_value.m_v.value;
    local_78.entry.m_node = local_a8.entry.m_node;
    local_78.merged_entry.m_node = local_a8.merged_entry.m_node;
    local_78.merged_entry.m_value.m_v.type_and_size =
         local_a8.merged_entry.m_value.m_v.type_and_size;
  }
  else {
    if (uVar4 != 0xc) goto LAB_001fc012;
    pmVar5 = &this->sG->process_blackboard_lock;
    std::mutex::lock(pmVar5);
    anon_unknown.dwarf_36ee15::load_current_entry(&local_a8,attr,key,&this->sG->process_blackboard);
    local_78.entry.m_value.m_v.type_and_size = local_a8.entry.m_value.m_v.type_and_size;
    local_78.entry.m_value.m_v.value = local_a8.entry.m_value.m_v.value;
    local_78.merged_entry.m_value.m_v.value = local_a8.merged_entry.m_value.m_v.value;
    local_78.entry.m_node = local_a8.entry.m_node;
    local_78.merged_entry.m_node = local_a8.merged_entry.m_node;
    local_78.merged_entry.m_value.m_v.type_and_size =
         local_a8.merged_entry.m_value.m_v.type_and_size;
    pthread_mutex_unlock((pthread_mutex_t *)pmVar5);
  }
  if (local_78.entry.m_node == (Node *)0x0) {
    this->sT->stack_error = true;
  }
  else {
    if ((prop & 0x40) == 0) {
      pCVar6 = (this->sG->active_channels).
               super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar2 = (this->sG->active_channels).
               super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_48 = (Node *)local_78.entry.m_value.m_v.type_and_size;
      aStack_40 = local_78.entry.m_value.m_v.value;
      for (; pCVar6 != pCVar2; pCVar6 = pCVar6 + 1) {
        local_b8 = (pCVar6->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        local_a8.merged_entry.m_node = local_48;
        local_a8.merged_entry.m_value.m_v.type_and_size = aStack_40.v_uint;
        local_b0 = this;
        util::
        callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
        ::operator()((callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
                      *)&(local_b8->events).pre_end_evt,&local_b0,&local_b8,attr,
                     (Variant *)&local_a8);
      }
    }
    if (uVar4 == 0x14) {
      anon_unknown.dwarf_36ee15::handle_end
                (attr,prop,&local_78,key,&this->sT->thread_blackboard,&this->sT->tree);
    }
    else {
      pmVar5 = &this->sG->process_blackboard_lock;
      std::mutex::lock(pmVar5);
      anon_unknown.dwarf_36ee15::handle_end
                (attr,prop,&local_78,key,&this->sG->process_blackboard,&this->sT->tree);
      pthread_mutex_unlock((pthread_mutex_t *)pmVar5);
    }
  }
LAB_001fc012:
  (pTVar1->lock).m_lock = (pTVar1->lock).m_lock + -1;
  return;
}

Assistant:

void Caliper::end(const Attribute& attr)
{
    if (sT->stack_error)
        return;

    int prop  = attr.properties();
    int scope = prop & CALI_ATTR_SCOPE_MASK;

    bool run_events = !(prop & CALI_ATTR_SKIP_EVENTS);

    cali_id_t   key         = get_blackboard_key(attr.id(), prop);
    BlackboardEntry current = { Entry(), Entry( ) };

    std::lock_guard<::siglock> g(sT->lock);

    if (scope == CALI_ATTR_SCOPE_THREAD)
        current = load_current_entry(attr, key, sT->thread_blackboard);
    else if (scope == CALI_ATTR_SCOPE_PROCESS) {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        current = load_current_entry(attr, key, sG->process_blackboard);
    } else
        return;

    if (current.entry.empty()) {
        sT->stack_error = true;
        return;
    }

    // invoke callbacks
    if (run_events)
        for (auto& channel : sG->active_channels)
            channel.mP->events.pre_end_evt(this, channel.body(), attr, current.entry.value());

    if (scope == CALI_ATTR_SCOPE_THREAD)
        handle_end(attr, prop, current, key, sT->thread_blackboard, sT->tree);
    else {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        handle_end(attr, prop, current, key, sG->process_blackboard, sT->tree);
    }
}